

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O0

Mat operator+(Mat *left,Mat *right)

{
  ostream *this;
  int *in_RDX;
  Mat MVar1;
  int local_28;
  int i;
  Mat *right_local;
  Mat *left_local;
  Mat *Aux;
  
  if ((right->n_rows_ == *in_RDX) && (right->n_cols_ == in_RDX[1])) {
    Mat::Mat(left,right->n_rows_,right->n_cols_);
    for (local_28 = 0; local_28 < right->n_rows_ * right->n_cols_; local_28 = local_28 + 1) {
      left->v_[local_28] =
           right->v_[local_28] + *(double *)(*(long *)(in_RDX + 2) + (long)local_28 * 8);
    }
    MVar1.v_ = (double *)right;
    MVar1._0_8_ = left;
    return MVar1;
  }
  this = std::operator<<((ostream *)&std::cerr,"ERROR: Incompatible shape in +(Matrix,Matrix)");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  exit(1);
}

Assistant:

Mat operator + (const Mat& left, const Mat& right)
{
	if ( (left.n_rows_!=right.n_rows_) || (left.n_cols_!=right.n_cols_) ) {
		cerr << "ERROR: Incompatible shape in +(Matrix,Matrix)" << endl;
		exit(1);
	};
	Mat Aux(left.n_rows_,left.n_cols_);
	for (int i=0; i<left.n_rows_*left.n_cols_; i++) 	
		Aux.v_[i] = left.v_[i] + right.v_[i];
	return Aux;
}